

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O0

Result_t *
Kumu::WriteBufferIntoFile(Result_t *__return_storage_ptr__,ByteString *Buffer,string *Filename)

{
  FileWriter *this;
  int iVar1;
  ui32_t uVar2;
  byte_t *buf;
  Result_t local_140;
  undefined1 local_c8 [8];
  Result_t result;
  FileWriter Writer;
  ui32_t write_count;
  string *Filename_local;
  ByteString *Buffer_local;
  
  Writer.m_IOVec.m_p._4_4_ = 0;
  this = (FileWriter *)((long)&result.message.field_2 + 8);
  FileWriter::FileWriter(this);
  FileWriter::OpenWrite((Result_t *)local_c8,this,Filename);
  iVar1 = Result_t::operator_cast_to_int((Result_t *)local_c8);
  if (-1 < iVar1) {
    buf = ByteString::RoData(Buffer);
    uVar2 = ByteString::Length(Buffer);
    FileWriter::Write(&local_140,(FileWriter *)((long)&result.message.field_2 + 8),buf,uVar2,
                      (ui32_t *)((long)&Writer.m_IOVec.m_p + 4));
    Result_t::operator=((Result_t *)local_c8,&local_140);
    Result_t::~Result_t(&local_140);
  }
  iVar1 = Result_t::operator_cast_to_int((Result_t *)local_c8);
  if ((iVar1 < 0) || (uVar2 = ByteString::Length(Buffer), uVar2 == Writer.m_IOVec.m_p._4_4_)) {
    Result_t::Result_t(__return_storage_ptr__,(Result_t *)local_c8);
  }
  else {
    Result_t::Result_t(__return_storage_ptr__,(Result_t *)RESULT_WRITEFAIL);
  }
  Result_t::~Result_t((Result_t *)local_c8);
  FileWriter::~FileWriter((FileWriter *)((long)&result.message.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

Result_t
Kumu::WriteBufferIntoFile(const Kumu::ByteString& Buffer, const std::string& Filename)
{
  ui32_t write_count = 0;
  FileWriter Writer;

  Result_t result = Writer.OpenWrite(Filename);

  if ( KM_SUCCESS(result) )
    result = Writer.Write(Buffer.RoData(), Buffer.Length(), &write_count);

  if ( KM_SUCCESS(result) && Buffer.Length() != write_count) 
    return RESULT_WRITEFAIL;

  return result;
}